

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O3

ArgFlag * __thiscall
Utils::ArgumentParser::make_flag
          (ArgumentParser *this,string *name,string *description,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *flg)

{
  pointer *pppAVar1;
  iterator __position;
  pointer pbVar2;
  pointer pcVar3;
  iterator iVar4;
  ArgFlag *this_00;
  pointer pbVar5;
  ArgFlag *f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> i;
  ArgFlag *local_88;
  key_type local_80;
  _Base_ptr local_60;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Utils::ArgFlag_*>
  local_58;
  
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar4._M_node != &(this->used_name)._M_t._M_impl.super__Rb_tree_header) {
    __assert_fail("used_name.find(name) == used_name.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                  ,0x120,
                  "ArgFlag &Utils::ArgumentParser::make_flag(const std::string &, const std::string &, const std::vector<std::string> &)"
                 );
  }
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string_const&>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this,name);
  this_00 = (ArgFlag *)operator_new(0x68);
  ArgFlag::ArgFlag(this_00,name,description,flg);
  __position._M_current =
       (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl
       .super__Vector_impl_data._M_finish;
  local_88 = this_00;
  if (__position._M_current ==
      (this->flags).super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<Utils::ArgFlag*,std::allocator<Utils::ArgFlag*>>::
    _M_realloc_insert<Utils::ArgFlag*const&>
              ((vector<Utils::ArgFlag*,std::allocator<Utils::ArgFlag*>> *)&this->flags,__position,
               &local_88);
  }
  else {
    *__position._M_current = this_00;
    pppAVar1 = &(this->flags).
                super__Vector_base<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppAVar1 = *pppAVar1 + 1;
  }
  pbVar5 = (flg->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (flg->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar5 != pbVar2) {
    local_60 = &(this->used_identifier)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      pcVar3 = (pbVar5->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_80,pcVar3,pcVar3 + pbVar5->_M_string_length);
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->used_identifier)._M_t,&local_80);
      if (iVar4._M_node != local_60) {
        __assert_fail("used_identifier.find(i) == used_identifier.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/GiuMaz[P]satyricon/include/ArgumentParser.hpp"
                      ,0x127,
                      "ArgFlag &Utils::ArgumentParser::make_flag(const std::string &, const std::string &, const std::vector<std::string> &)"
                     );
      }
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&this->used_identifier,&local_80);
      local_58.first._M_dataplus._M_p = (pointer)&local_58.first.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,local_80._M_dataplus._M_p,
                 local_80._M_dataplus._M_p + local_80._M_string_length);
      local_58.second = local_88;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ArgObject*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>>
      ::_M_emplace_unique<std::pair<std::__cxx11::string,Utils::ArgFlag*>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,Utils::ArgObject*>,std::_Select1st<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,Utils::ArgObject*>>>
                  *)&this->flag_mapping,&local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.first._M_dataplus._M_p != &local_58.first.field_2) {
        operator_delete(local_58.first._M_dataplus._M_p,
                        local_58.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      pbVar5 = pbVar5 + 1;
    } while (pbVar5 != pbVar2);
  }
  return local_88;
}

Assistant:

inline ArgFlag& ArgumentParser::make_flag( const std::string& name,
        const std::string& description, const std::vector<std::string>& flg) {
    assert(used_name.find(name) == used_name.end());
    used_name.insert(name);

    auto f = new ArgFlag(name,description,flg);
    flags.push_back(f);

    for ( auto i : flg ) {
        assert(used_identifier.find(i) == used_identifier.end());
        used_identifier.insert(i);

        flag_mapping.insert( std::make_pair(i, f));
    }

    return *f;
}